

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O1

int suite_tcase(Suite *s,char *tcname)

{
  List *lp;
  int iVar1;
  undefined8 *puVar2;
  
  if (s != (Suite *)0x0) {
    lp = s->tclst;
    check_list_front(lp);
    while (iVar1 = check_list_at_end(lp), iVar1 == 0) {
      puVar2 = (undefined8 *)check_list_val(lp);
      iVar1 = strcmp(tcname,(char *)*puVar2);
      if (iVar1 == 0) {
        return 1;
      }
      check_list_advance(lp);
    }
  }
  return 0;
}

Assistant:

int suite_tcase(Suite * s, const char *tcname)
{
    List *l;

    if(s == NULL)
        return 0;

    l = s->tclst;
    for(check_list_front(l); !check_list_at_end(l); check_list_advance(l))
    {
        TCase *tc = (TCase *)check_list_val(l);
        if(strcmp(tcname, tc->name) == 0)
            return 1;
    }

    return 0;
}